

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regset.c
# Opt level: O3

void time_compare(int n,char **ps,char *s,char *end)

{
  size_t __size;
  bool bVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  OnigRegSet *pOVar5;
  int iVar6;
  uint uVar7;
  char **pat;
  clock_t cVar8;
  clock_t cVar9;
  clock_t cVar10;
  clock_t cVar11;
  int iVar12;
  uint uVar13;
  char *pcVar14;
  char *in_R8;
  ulong uVar15;
  undefined1 local_88 [72];
  OnigRegSet *local_40;
  int match_pos;
  
  __size = (ulong)(uint)n * 8;
  pat = (char **)malloc(__size);
  if (pat != (char **)0x0) {
    iVar12 = 0;
    dVar3 = 0.0;
    dVar4 = 0.0;
    if (0 < n) {
      local_88._0_16_ = ZEXT816(0);
      do {
        memcpy(pat,ps,__size);
        uVar15 = (ulong)(uint)n;
        if (n != 1) {
          do {
            iVar6 = rand();
            iVar6 = iVar6 % (int)uVar15;
            pcVar14 = pat[uVar15 - 1];
            pat[uVar15 - 1] = pat[iVar6];
            pat[iVar6] = pcVar14;
            bVar1 = 2 < uVar15;
            uVar15 = uVar15 - 1;
          } while (bVar1);
        }
        iVar6 = make_regset(0,n,pat,&local_40,(int)in_R8);
        if (iVar6 != 0) {
LAB_00102a61:
          free(pat);
          return;
        }
        cVar8 = clock();
        pOVar5 = local_40;
        uVar13 = 100U / (uint)n;
        if ((uint)n < 0x65) {
          do {
            in_R8 = end;
            uVar7 = onig_regset_search(pOVar5,s,end,s,end,0,0,&match_pos);
            if ((int)uVar7 < 0) {
              pcVar14 = "FAIL onig_regset_search(POSITION_LEAD): %d\n";
              goto LAB_00102a50;
            }
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        cVar9 = clock();
        cVar10 = clock();
        uVar13 = 100U / (uint)n;
        if ((uint)n < 0x65) {
          do {
            in_R8 = end;
            uVar7 = onig_regset_search(pOVar5,s,end,s,end,1,0,&match_pos);
            if ((int)uVar7 < 0) {
              pcVar14 = "FAIL onig_regset_search(REGEX_LEAD): %d\n";
LAB_00102a50:
              fprintf(_stderr,pcVar14,(ulong)uVar7);
              onig_regset_free(pOVar5);
              goto LAB_00102a61;
            }
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        cVar11 = clock();
        dVar3 = (double)local_88._0_8_ + (double)(cVar9 - cVar8) / 1000000.0;
        dVar4 = (double)local_88._8_8_ + (double)(cVar11 - cVar10) / 1000000.0;
        local_88._8_4_ = SUB84(dVar4,0);
        local_88._0_8_ = dVar3;
        local_88._12_4_ = (int)((ulong)dVar4 >> 0x20);
        onig_regset_free(pOVar5);
        iVar12 = iVar12 + 1;
      } while (iVar12 != n);
      dVar3 = dVar3 * 1000.0;
      dVar4 = (double)local_88._8_8_ * 1000.0;
    }
    auVar2._8_4_ = SUB84(dVar4,0);
    auVar2._0_8_ = dVar3;
    auVar2._12_4_ = (int)((ulong)dVar4 >> 0x20);
    free(pat);
    local_88._8_8_ = auVar2._8_8_;
    fprintf(_stdout,"POS lead: %6.2lfmsec.  REG lead: %6.2lfmsec.\n",SUB84(dVar3,0),local_88._8_8_);
  }
  return;
}

Assistant:

static void
time_compare(int n, char* ps[], char* s, char* end)
{
  int r;
  int i;
  int repeat;
  double t_set, t_reg;
  double total_set, total_reg;
  char** cps;

  cps = (char** )malloc(sizeof(char*) * n);
  if (cps == 0) return ;

  repeat = 100 / n;
  total_set = total_reg = 0.0;
  for (i = 0; i < n; i++) {
    fisher_yates_shuffle(n, ps, cps);
    r = time_test(repeat, n, cps, s, end, &t_set, &t_reg);
    if (r != 0) {
      free(cps);
      return ;
    }
    total_set += t_set;
    total_reg += t_reg;
  }

  free(cps);

  fprintf(stdout, "POS lead: %6.2lfmsec.  REG lead: %6.2lfmsec.\n",
          total_set * 1000.0, total_reg * 1000.0);
}